

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_0::TextureLookupSpec::TextureLookupSpec
          (TextureLookupSpec *this,Function function_,Vec4 *minCoord_,Vec4 *maxCoord_,bool useBias_,
          float minLodBias_,float maxLodBias_,Vec3 *minDX_,Vec3 *maxDX_,Vec3 *minDY_,Vec3 *maxDY_,
          bool useOffset_,IVec3 *offset_)

{
  long lVar1;
  
  this->function = function_;
  lVar1 = 0;
  do {
    (this->minCoord).m_data[lVar1] = minCoord_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    (this->maxCoord).m_data[lVar1] = maxCoord_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  this->useBias = useBias_;
  this->minLodBias = minLodBias_;
  this->maxLodBias = maxLodBias_;
  lVar1 = 0;
  do {
    (this->minDX).m_data[lVar1] = minDX_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    (this->maxDX).m_data[lVar1] = maxDX_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    (this->minDY).m_data[lVar1] = minDY_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    (this->maxDY).m_data[lVar1] = maxDY_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  this->useOffset = useOffset_;
  lVar1 = 0;
  do {
    (this->offset).m_data[lVar1] = offset_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

TextureLookupSpec (Function				function_,
					   const tcu::Vec4&		minCoord_,
					   const tcu::Vec4&		maxCoord_,
					   bool					useBias_,
					   float				minLodBias_,
					   float				maxLodBias_,
					   const tcu::Vec3&		minDX_,
					   const tcu::Vec3&		maxDX_,
					   const tcu::Vec3&		minDY_,
					   const tcu::Vec3&		maxDY_,
					   bool					useOffset_,
					   const tcu::IVec3&	offset_)
		: function		(function_)
		, minCoord		(minCoord_)
		, maxCoord		(maxCoord_)
		, useBias		(useBias_)
		, minLodBias	(minLodBias_)
		, maxLodBias	(maxLodBias_)
		, minDX			(minDX_)
		, maxDX			(maxDX_)
		, minDY			(minDY_)
		, maxDY			(maxDY_)
		, useOffset		(useOffset_)
		, offset		(offset_)
	{
	}